

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CheckboxFlagsT<int>(char *label,int *flags,int flags_value)

{
  ImGuiItemFlags IVar1;
  ImGuiWindow *pIVar2;
  ImGuiItemFlags backup_item_flags;
  ImGuiWindow *window;
  bool pressed;
  bool any_on;
  bool all_on;
  uint *puStack_18;
  int flags_value_local;
  int *flags_local;
  char *label_local;
  
  window._3_1_ = (*flags & flags_value) == flags_value;
  window._2_1_ = (*flags & flags_value) != 0;
  window._4_4_ = flags_value;
  puStack_18 = (uint *)flags;
  flags_local = (int *)label;
  if (((bool)window._3_1_) || (!(bool)window._2_1_)) {
    window._1_1_ = Checkbox(label,(bool *)((long)&window + 3));
  }
  else {
    pIVar2 = GetCurrentWindow();
    IVar1 = (pIVar2->DC).ItemFlags;
    (pIVar2->DC).ItemFlags = (pIVar2->DC).ItemFlags | 0x40;
    window._1_1_ = Checkbox((char *)flags_local,(bool *)((long)&window + 3));
    (pIVar2->DC).ItemFlags = IVar1;
  }
  if (window._1_1_ != false) {
    if ((window._3_1_ & 1) == 0) {
      *puStack_18 = (window._4_4_ ^ 0xffffffff) & *puStack_18;
    }
    else {
      *puStack_18 = window._4_4_ | *puStack_18;
    }
  }
  return window._1_1_;
}

Assistant:

bool ImGui::CheckboxFlagsT(const char* label, T* flags, T flags_value)
{
    bool all_on = (*flags & flags_value) == flags_value;
    bool any_on = (*flags & flags_value) != 0;
    bool pressed;
    if (!all_on && any_on)
    {
        ImGuiWindow* window = GetCurrentWindow();
        ImGuiItemFlags backup_item_flags = window->DC.ItemFlags;
        window->DC.ItemFlags |= ImGuiItemFlags_MixedValue;
        pressed = Checkbox(label, &all_on);
        window->DC.ItemFlags = backup_item_flags;
    }
    else
    {
        pressed = Checkbox(label, &all_on);

    }
    if (pressed)
    {
        if (all_on)
            *flags |= flags_value;
        else
            *flags &= ~flags_value;
    }
    return pressed;
}